

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

void * pem_read_RSA_PUBKEY_d2i(void **x,uchar **inp,long len)

{
  RSA *pRVar1;
  long len_local;
  uchar **inp_local;
  void **x_local;
  
  pRVar1 = d2i_RSA_PUBKEY((RSA **)x,inp,len);
  return pRVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}